

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t binarySearch(uint16_t *array,int32_t lenarray,uint16_t ikey)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (lenarray < 1) {
    return -1;
  }
  iVar4 = lenarray + -1;
  uVar3 = 0;
  do {
    uVar2 = uVar3 + iVar4 >> 1;
    uVar1 = *(ushort *)((long)array + (ulong)(uVar3 + iVar4 & 0xfffffffe));
    if (uVar1 < ikey) {
      uVar3 = uVar2 + 1;
    }
    else {
      if (uVar1 <= ikey) {
        return uVar2;
      }
      iVar4 = uVar2 - 1;
    }
  } while ((int)uVar3 <= iVar4);
  return ~uVar3;
}

Assistant:

inline int32_t binarySearch(const uint16_t *array, int32_t lenarray,
                            uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = array[middleIndex];
        if (middleValue < ikey) {
            low = middleIndex + 1;
        } else if (middleValue > ikey) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}